

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
          ArrayPtr<const_char> *rest_3)

{
  char *pos_00;
  
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,first);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (this,pos_00,branchIndex,rest,rest_1,rest_2,rest_3);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}